

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void NULLCFile::FileSeek(int dir,int shift,File *file)

{
  File *file_local;
  int shift_local;
  int dir_local;
  
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else if (file->handle == (FILE *)0x0) {
    nullcThrowError("Cannot seek in a closed file.");
  }
  else {
    fseek((FILE *)file->handle,(long)shift,dir);
  }
  return;
}

Assistant:

void FileSeek(int dir, int shift, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot seek in a closed file.");
			return;
		}

		fseek(file->handle, shift, dir);
	}